

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall Editor::deleteArea(Editor *this)

{
  Editor *in_RDI;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar1;
  unique_ptr<commands::FillArea,_std::default_delete<commands::FillArea>_> command;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> bounds;
  Vector2i *second;
  Editor *in_stack_ffffffffffffffc0;
  Vector2i in_stack_ffffffffffffffe0;
  Editor *this_00;
  
  this_00 = in_RDI;
  pVar1 = Board::getHighlightedBounds((Board *)this);
  if (pVar1.first.x <= pVar1.second.x) {
    second = (Vector2i *)&stack0xffffffffffffffe0;
    makeCommand<commands::FillArea,Board&,TilePool&>
              (this_00,(Board *)pVar1.second,(TilePool *)pVar1.first);
    (anonymous_namespace)::forEachTile<Editor::deleteArea()::__0>
              ((Board *)pVar1.first,(Vector2i *)in_stack_ffffffffffffffe0,second,
               (anon_class_8_1_bc00122b)pVar1.second);
    std::unique_ptr<Command,std::default_delete<Command>>::
    unique_ptr<commands::FillArea,std::default_delete<commands::FillArea>,void>
              ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffffc0,
               (unique_ptr<commands::FillArea,_std::default_delete<commands::FillArea>_> *)in_RDI);
    executeCommand(in_stack_ffffffffffffffc0,
                   (unique_ptr<Command,_std::default_delete<Command>_> *)in_RDI);
    std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
              ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffffc0);
    Board::removeAllHighlights((Board *)in_stack_ffffffffffffffe0);
    std::unique_ptr<commands::FillArea,_std::default_delete<commands::FillArea>_>::~unique_ptr
              ((unique_ptr<commands::FillArea,_std::default_delete<commands::FillArea>_> *)second);
  }
  return;
}

Assistant:

void Editor::deleteArea() {
    auto bounds = board_.getHighlightedBounds();
    if (bounds.first.x > bounds.second.x) {
        return;
    }
    auto command = makeCommand<commands::FillArea>(board_, tilePool_);
    forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
        Tile tile = chunk.accessTile(i);
        if (tile.getHighlight()) {
            command->pushBackTile({x, y}).setType(tiles::Blank::instance());
        }
    });
    executeCommand(std::move(command));
    board_.removeAllHighlights();
}